

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.cpp
# Opt level: O3

Color4<double> * Imath_3_2::rgb2hsv_d(Color4<double> *c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Color4<double> *in_RDI;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = c->r;
  dVar2 = c->g;
  dVar3 = c->b;
  dVar4 = dVar1;
  if (dVar1 <= dVar2) {
    dVar4 = dVar2;
  }
  if (dVar4 <= dVar3) {
    dVar4 = dVar3;
  }
  dVar6 = dVar1;
  if (dVar2 <= dVar1) {
    dVar6 = dVar2;
  }
  if (dVar3 <= dVar6) {
    dVar6 = dVar3;
  }
  dVar6 = dVar4 - dVar6;
  dVar7 = 0.0;
  dVar5 = (double)(-(ulong)(dVar4 != 0.0) & (ulong)(dVar6 / dVar4));
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    if ((dVar1 != dVar4) || (NAN(dVar1) || NAN(dVar4))) {
      if ((dVar2 != dVar4) || (NAN(dVar2) || NAN(dVar4))) {
        dVar6 = (dVar1 - dVar2) / dVar6 + 4.0;
      }
      else {
        dVar6 = (dVar3 - dVar1) / dVar6 + 2.0;
      }
    }
    else {
      dVar6 = (dVar2 - dVar3) / dVar6;
    }
    dVar6 = dVar6 / 6.0;
    dVar7 = (double)(~-(ulong)(dVar6 < 0.0) & (ulong)dVar6 |
                    (ulong)(dVar6 + 1.0) & -(ulong)(dVar6 < 0.0));
  }
  dVar1 = c->a;
  in_RDI->r = dVar7;
  in_RDI->g = dVar5;
  in_RDI->b = dVar4;
  in_RDI->a = dVar1;
  return in_RDI;
}

Assistant:

Color4<double>
rgb2hsv_d (const Color4<double>& c) IMATH_NOEXCEPT
{
    const double& r = c.r;
    const double& g = c.g;
    const double& b = c.b;

    double max   = (r > g) ? ((r > b) ? r : b) : ((g > b) ? g : b);
    double min   = (r < g) ? ((r < b) ? r : b) : ((g < b) ? g : b);
    double range = max - min;
    double val   = max;
    double sat   = 0;
    double hue   = 0;

    if (max != 0) sat = range / max;

    if (sat != 0)
    {
        double h;

        if (r == max)
            h = (g - b) / range;
        else if (g == max)
            h = 2 + (b - r) / range;
        else
            h = 4 + (r - g) / range;

        hue = h / 6.;

        if (hue < 0.) hue += 1.0;
    }
    return Color4<double> (hue, sat, val, c.a);
}